

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

void Abc_NtkPartitionPrint(Abc_Ntk_t *pNtk,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (vPartSuppsAll->nSize < 1) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      if ((long)vPartsAll->nSize <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar1 = *(uint *)((long)vPartsAll->pArray[uVar3] + 4);
      printf("%d=(%d,%d) ",uVar3 & 0xffffffff,
             (ulong)*(uint *)((long)vPartSuppsAll->pArray[uVar3] + 4),(ulong)uVar1);
      uVar2 = uVar2 + uVar1;
    } while ((uVar3 != vPartsAll->nSize - 1) &&
            (uVar3 = uVar3 + 1, (long)uVar3 < (long)vPartSuppsAll->nSize));
  }
  printf("\nTotal = %d. Outputs = %d.\n",(ulong)uVar2,(ulong)(uint)pNtk->vCos->nSize);
  return;
}

Assistant:

void Abc_NtkPartitionPrint( Abc_Ntk_t * pNtk, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
//    assert( Counter == Abc_NtkCoNum(pNtk) );
    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Abc_NtkCoNum(pNtk) );
}